

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# register_allocation.cpp
# Opt level: O0

void __thiscall mocker::detail::InterferenceGraph::classifyNode(InterferenceGraph *this,Node *n)

{
  bool bVar1;
  anon_class_8_1_54a3980e local_40;
  anon_class_8_1_54a3980e removeIfExists;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> local_30;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> local_28;
  _Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> local_20;
  key_type *local_18;
  Node *n_local;
  InterferenceGraph *this_local;
  
  local_18 = n;
  n_local = (Node *)this;
  bVar1 = isPrecolored(n);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!isPrecolored(n)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf2,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ::find(&this->coalesced,local_18);
  local_28._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ::end(&this->coalesced);
  bVar1 = std::__detail::operator==(&local_20,&local_28);
  if (!bVar1) {
    __assert_fail("coalesced.find(n) == coalesced.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf3,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  local_30._M_cur =
       (__node_type *)
       std::
       unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
       ::find(&this->removed,local_18);
  removeIfExists.n =
       (Node *)std::
               unordered_set<std::shared_ptr<mocker::nasm::Register>,_mocker::nasm::RegPtrHash,_mocker::nasm::RegPtrEqual,_std::allocator<std::shared_ptr<mocker::nasm::Register>_>_>
               ::end(&this->removed);
  bVar1 = std::__detail::operator==
                    (&local_30,
                     (_Node_iterator_base<std::shared_ptr<mocker::nasm::Register>,_true> *)
                     &removeIfExists);
  if (!bVar1) {
    __assert_fail("removed.find(n) == removed.end()",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/codegen/register_allocation.cpp"
                  ,0xf4,"void mocker::detail::InterferenceGraph::classifyNode(const Node &)");
  }
  local_40.n = local_18;
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_40,&this->simplifiable);
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_40,&this->highDegree);
  classifyNode::anon_class_8_1_54a3980e::operator()(&local_40,&this->freeze);
  bVar1 = isOfHighDegree(this,local_18);
  if (bVar1) {
    std::
    unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
    ::emplace<std::shared_ptr<mocker::nasm::Register>const&>
              ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                *)&this->highDegree,local_18);
  }
  else {
    bVar1 = std::function<bool_(const_std::shared_ptr<mocker::nasm::Register>_&)>::operator()
                      (&this->isMoveRelated,local_18);
    if (bVar1) {
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
      ::emplace<std::shared_ptr<mocker::nasm::Register>const&>
                ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                  *)&this->freeze,local_18);
    }
    else {
      std::
      unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
      ::emplace<std::shared_ptr<mocker::nasm::Register>const&>
                ((unordered_set<std::shared_ptr<mocker::nasm::Register>,mocker::nasm::RegPtrHash,mocker::nasm::RegPtrEqual,std::allocator<std::shared_ptr<mocker::nasm::Register>>>
                  *)&this->simplifiable,local_18);
    }
  }
  return;
}

Assistant:

void InterferenceGraph::classifyNode(const Node &n) {
  assert(!isPrecolored(n));
  assert(coalesced.find(n) == coalesced.end());
  assert(removed.find(n) == removed.end());

  auto removeIfExists = [&n](RegSet &s) {
    auto iter = s.find(n);
    if (iter != s.end())
      s.erase(iter);
  };

  removeIfExists(simplifiable);
  removeIfExists(highDegree);
  removeIfExists(freeze);
  if (isOfHighDegree(n)) {
    highDegree.emplace(n);
    return;
  }
  if (isMoveRelated(n)) {
    freeze.emplace(n);
    return;
  }
  simplifiable.emplace(n);
}